

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

ArgSlot EmitArgList(ParseNode *pnode,RegSlot thisLocation,RegSlot newTargetLocation,BOOL fIsEval,
                   BOOL fAssignRegs,ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo,
                   ProfileId callSiteId,ArgSlot argsCountForStartCall,bool emitArgOutsAtEnd,
                   bool emitProfiledArgouts,uint16 spreadArgCount,
                   AuxArray<unsigned_int> **spreadIndices)

{
  code *pcVar1;
  bool bVar2;
  ArgSlot AVar3;
  uint32 uVar4;
  ByteCodeWriter *this;
  undefined4 *puVar5;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar6;
  AuxArray<unsigned_int> *this_00;
  AuxArray<unsigned_int> *local_110;
  AuxArray<unsigned_int> *local_e0;
  size_t sStack_80;
  ArgSlot argumentsCount;
  size_t argIndex;
  TrackAllocData local_68;
  ulong local_40;
  size_t extraAlloc;
  RegSlot evalLocation;
  bool emitProfiledArgouts_local;
  bool emitArgOutsAtEnd_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  BOOL fAssignRegs_local;
  BOOL fIsEval_local;
  RegSlot newTargetLocation_local;
  RegSlot thisLocation_local;
  ParseNode *pnode_local;
  
  extraAlloc._7_1_ = emitArgOutsAtEnd;
  extraAlloc._6_1_ = emitProfiledArgouts;
  _evalLocation = byteCodeGenerator;
  byteCodeGenerator_local._0_4_ = fAssignRegs;
  byteCodeGenerator_local._4_4_ = fIsEval;
  fAssignRegs_local = newTargetLocation;
  fIsEval_local = thisLocation;
  _newTargetLocation_local = pnode;
  if (!emitArgOutsAtEnd) {
    this = ByteCodeGenerator::Writer(byteCodeGenerator);
    Js::ByteCodeWriter::StartCall(this,StartCall,argsCountForStartCall);
    EmitArgListStart(fIsEval_local,_evalLocation,funcInfo,callSiteId);
  }
  extraAlloc._0_4_ = 0xffffffff;
  if (byteCodeGenerator_local._4_4_ != 0) {
    extraAlloc._0_4_ = FuncInfo::AcquireTmpRegister(funcInfo);
  }
  if (spreadArgCount != 0) {
    uVar4 = UInt32Math::Mul((uint)spreadArgCount,4);
    local_40 = (ulong)uVar4;
    if (spreadIndices == (AuxArray<unsigned_int> **)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x1dfe,"(spreadIndices != nullptr)","spreadIndices != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    pAVar6 = &ByteCodeGenerator::GetAllocator(_evalLocation)->
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_68,(type_info *)&Js::AuxArray<unsigned_int>::typeinfo,local_40,
               0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
               ,0x1dff);
    pAVar6 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(pAVar6,&local_68);
    this_00 = (AuxArray<unsigned_int> *)
              new<Memory::ArenaAllocator>(4,(ArenaAllocator *)pAVar6,0x3f67b0,0);
    Js::AuxArray<unsigned_int>::AuxArray(this_00,(uint)spreadArgCount);
    *spreadIndices = this_00;
  }
  if ((extraAlloc._7_1_ & 1) == 0) {
    if (spreadIndices == (AuxArray<unsigned_int> **)0x0) {
      local_110 = (AuxArray<unsigned_int> *)0x0;
    }
    else {
      local_110 = *spreadIndices;
    }
    sStack_80 = EmitArgs(_newTargetLocation_local,(BOOL)byteCodeGenerator_local,_evalLocation,
                         funcInfo,callSiteId,(bool)(extraAlloc._6_1_ & 1),local_110);
  }
  else {
    if (spreadIndices == (AuxArray<unsigned_int> **)0x0) {
      local_e0 = (AuxArray<unsigned_int> *)0x0;
    }
    else {
      local_e0 = *spreadIndices;
    }
    sStack_80 = EmitArgsWithArgOutsAtEnd
                          (_newTargetLocation_local,(BOOL)byteCodeGenerator_local,_evalLocation,
                           funcInfo,callSiteId,fIsEval_local,argsCountForStartCall,
                           (bool)(extraAlloc._6_1_ & 1),local_e0);
  }
  AVar3 = EmitArgListEnd(_newTargetLocation_local,fIsEval_local,(RegSlot)extraAlloc,
                         fAssignRegs_local,_evalLocation,funcInfo,sStack_80,callSiteId);
  if (byteCodeGenerator_local._4_4_ != 0) {
    FuncInfo::ReleaseTmpRegister(funcInfo,(RegSlot)extraAlloc);
  }
  return AVar3;
}

Assistant:

Js::ArgSlot EmitArgList(
    ParseNode *pnode,
    Js::RegSlot thisLocation,
    Js::RegSlot newTargetLocation,
    BOOL fIsEval,
    BOOL fAssignRegs,
    ByteCodeGenerator *byteCodeGenerator,
    FuncInfo *funcInfo,
    Js::ProfileId callSiteId,
    Js::ArgSlot argsCountForStartCall,
    bool emitArgOutsAtEnd,
    bool emitProfiledArgouts,
    uint16 spreadArgCount = 0,
    Js::AuxArray<uint32> **spreadIndices = nullptr)
{
    // This function emits the arguments for a call.
    // ArgOut's with uses immediately following defs.
    if (!emitArgOutsAtEnd)
    {
        byteCodeGenerator->Writer()->StartCall(Js::OpCode::StartCall, argsCountForStartCall);
        EmitArgListStart(thisLocation, byteCodeGenerator, funcInfo, callSiteId);
    }

    Js::RegSlot evalLocation = Js::Constants::NoRegister;

    //
    // If Emitting arguments for eval and assigning registers, get a tmpLocation for eval.
    // This would be used while generating frameDisplay in EmitArgListEnd.
    //
    if (fIsEval)
    {
        evalLocation = funcInfo->AcquireTmpRegister();
    }

    if (spreadArgCount > 0)
    {
        const size_t extraAlloc = UInt32Math::Mul(spreadArgCount, sizeof(uint32));
        Assert(spreadIndices != nullptr);
        *spreadIndices = AnewPlus(byteCodeGenerator->GetAllocator(), extraAlloc, Js::AuxArray<uint32>, spreadArgCount);
    }

    size_t argIndex = 0;
    if (emitArgOutsAtEnd)
    {
        argIndex = EmitArgsWithArgOutsAtEnd(pnode, fAssignRegs, byteCodeGenerator, funcInfo, callSiteId, thisLocation, argsCountForStartCall, emitProfiledArgouts, spreadIndices == nullptr ? nullptr : *spreadIndices);
    }
    else
    {
        argIndex = EmitArgs(pnode, fAssignRegs, byteCodeGenerator, funcInfo, callSiteId, emitProfiledArgouts, spreadIndices == nullptr ? nullptr : *spreadIndices);
    }

    Js::ArgSlot argumentsCount = EmitArgListEnd(pnode, thisLocation, evalLocation, newTargetLocation, byteCodeGenerator, funcInfo, argIndex, callSiteId);

    if (fIsEval)
    {
        funcInfo->ReleaseTmpRegister(evalLocation);
    }

    return argumentsCount;
}